

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvt2triphone.c
# Opt level: O0

word_posn_t btw_posn(char btw_mark,word_posn_t posn)

{
  word_posn_t local_10;
  word_posn_t posn_local;
  char btw_mark_local;
  
  local_10 = posn;
  if (btw_mark == '\0') {
    if (posn == WORD_POSN_BEGIN) {
      local_10 = WORD_POSN_INTERNAL;
    }
    else if ((posn == WORD_POSN_END) || (posn == WORD_POSN_SINGLE)) {
      local_10 = WORD_POSN_BEGIN;
    }
    else if (posn != WORD_POSN_INTERNAL) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
              ,0x7b,"Unhandled word position\n");
      exit(1);
    }
  }
  else if ((posn == WORD_POSN_INTERNAL) || (posn == WORD_POSN_BEGIN)) {
    local_10 = WORD_POSN_END;
  }
  else if (posn == WORD_POSN_END) {
    local_10 = WORD_POSN_SINGLE;
  }
  else if (posn != WORD_POSN_SINGLE) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/cvt2triphone.c"
            ,0x6f,"Unhandled word position\n");
    exit(1);
  }
  return local_10;
}

Assistant:

word_posn_t btw_posn(char btw_mark,
		     word_posn_t posn)
{
    if (btw_mark) {
	if ((posn == WORD_POSN_INTERNAL) ||
	    (posn == WORD_POSN_BEGIN)) {
	    posn = WORD_POSN_END;
	}
	else if (posn == WORD_POSN_END) {
	    posn = WORD_POSN_SINGLE;
	}
	else if (posn == WORD_POSN_SINGLE)
	    ;	/* Don't change in this case */
	else {
	    E_FATAL("Unhandled word position\n");
	}
    }
    else {
	if (posn == WORD_POSN_BEGIN) {
	    posn = WORD_POSN_INTERNAL;
	} else if ((posn == WORD_POSN_END) ||
		   (posn == WORD_POSN_SINGLE)) {
	    posn = WORD_POSN_BEGIN;
	} else if (posn == WORD_POSN_INTERNAL)
	    ;	/* Don't change posn's value in this case */
	else {
	    E_FATAL("Unhandled word position\n");
	}
    }

    return posn;
}